

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_LogInt(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  char *pcVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  uVar4 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          auVar7 = (**(code **)*puVar1)(puVar1);
          uVar4 = auVar7._8_8_;
          puVar1[1] = auVar7._0_8_;
        }
        pPVar3 = (PClass *)puVar1[1];
        bVar6 = pPVar3 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar6);
        uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar6);
        if (pPVar3 != pPVar2 && !bVar6) {
          do {
            pPVar3 = pPVar3->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar3 != (PClass *)0x0);
            if (pPVar3 == pPVar2) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d2b43;
        }
      }
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          Printf("%d\n",(ulong)(uint)param[1].field_0.i,uVar4,ret);
          return 0;
        }
        pcVar5 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc95,
                    "int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d2b43:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc94,"int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LogInt)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(num);
	Printf("%d\n", num);
	return 0;
}